

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O1

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraID
          (VClient *this,string *i_rCameraName,uint *o_rCameraID)

{
  Enum EVar1;
  VCameraInfo *pVVar2;
  Enum GetResult;
  scoped_lock Lock;
  Enum local_2c;
  unique_lock<boost::recursive_mutex> local_28;
  
  local_28.m = &this->m_FrameMutex;
  local_28.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_28);
  ClientUtils::Clear(o_rCameraID);
  local_2c = Success;
  pVVar2 = GetCamera(this,i_rCameraName,&local_2c);
  EVar1 = local_2c;
  if (pVVar2 != (VCameraInfo *)0x0) {
    *o_rCameraID = pVVar2->m_CameraID;
  }
  if (local_28.is_locked == true) {
    boost::recursive_mutex::unlock(local_28.m);
  }
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraID( const std::string & i_rCameraName, unsigned int & o_rCameraID ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Clear( o_rCameraID );

  Result::Enum GetResult = Result::Success;
  const ViconCGStream::VCameraInfo * pCamera = GetCamera( i_rCameraName, GetResult );
  if ( pCamera )
  {
    o_rCameraID = pCamera->m_CameraID;
  }
  return GetResult;
}